

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

Clause * __thiscall seq_precede_inc::explain(seq_precede_inc *this,Lit param_2,int inf_id)

{
  tag_t tVar1;
  undefined4 in_ESI;
  int *in_RDI;
  tag_t t;
  int in_stack_00000088;
  int in_stack_0000008c;
  seq_precede_inc *in_stack_00000090;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  tVar1 = conv<seq_precede_inc::tag_t,int>(in_RDI);
  if (((uint)tVar1 & 1) == 0) {
    local_8 = ex_lb(in_stack_00000090,in_stack_0000008c,in_stack_00000088);
  }
  else {
    local_8 = ex_ub((seq_precede_inc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return local_8;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		const tag_t t(conv<tag_t, int>(inf_id));
		if (t.flag) {
			// Upper bound
			return ex_ub(t.x, t.k);
		}  // Lower bound
		return ex_lb(t.x, t.k);
	}